

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_enumerator.cpp
# Opt level: O2

bool __thiscall duckdb::PlanEnumerator::EmitCSG(PlanEnumerator *this,JoinRelationSet *node)

{
  bool bVar1;
  JoinRelationSet *pJVar2;
  reference __v;
  idx_t i;
  ulong uVar3;
  long lVar4;
  pointer puVar5;
  idx_t i_1;
  bool bVar6;
  vector<unsigned_long,_true> neighbors;
  unsigned_long neighbor;
  vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> connections;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  new_exclusion_set;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  exclusion_set;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  idx_t local_c0;
  _Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
  local_b8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  bVar6 = true;
  if (node->count !=
      (long)(this->query_graph_manager->relation_manager).relations.
            super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->query_graph_manager->relation_manager).relations.
            super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3) {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    for (local_a0._M_buckets = (__buckets_ptr)0x0;
        local_a0._M_buckets <
        *(__buckets_ptr *)
         (node->relations).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
         _M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>;
        local_a0._M_buckets = (__buckets_ptr)((long)local_a0._M_buckets + 1)) {
      ::std::__detail::
      _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&local_68,(value_type *)&local_a0);
    }
    lVar4 = 0;
    uVar3 = 0;
    local_a0._M_buckets = (__buckets_ptr)node;
    while( true ) {
      pJVar2 = optional_ptr<duckdb::JoinRelationSet,_true>::operator->
                         ((optional_ptr<duckdb::JoinRelationSet,_true> *)&local_a0);
      if (pJVar2->count <= uVar3) break;
      pJVar2 = optional_ptr<duckdb::JoinRelationSet,_true>::operator->
                         ((optional_ptr<duckdb::JoinRelationSet,_true> *)&local_a0);
      ::std::__detail::
      _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&local_68,
               (value_type *)
               ((long)(pJVar2->relations).
                      super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                      .super__Head_base<0UL,_unsigned_long_*,_false> + lVar4));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 8;
    }
    QueryGraphEdges::GetNeighbors
              ((vector<unsigned_long,_true> *)&local_d8,this->query_graph,node,
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)&local_68);
    if (local_d8._M_impl.super__Vector_impl_data._M_start ==
        local_d8._M_impl.super__Vector_impl_data._M_finish) {
      bVar6 = true;
    }
    else {
      ::std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<unsigned_long>>>
                ();
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_Hashtable(&local_a0,&local_68);
      uVar3 = 0;
      while( true ) {
        if ((ulong)((long)local_d8._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_d8._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar3) break;
        __v = vector<unsigned_long,_true>::get<true>((vector<unsigned_long,_true> *)&local_d8,uVar3)
        ;
        ::std::__detail::
        _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&local_a0,__v);
        uVar3 = uVar3 + 1;
      }
      for (puVar5 = local_d8._M_impl.super__Vector_impl_data._M_start;
          bVar6 = puVar5 == local_d8._M_impl.super__Vector_impl_data._M_finish, !bVar6;
          puVar5 = puVar5 + 1) {
        local_c0 = *puVar5;
        pJVar2 = JoinRelationSetManager::GetJoinRelation
                           (&this->query_graph_manager->set_manager,local_c0);
        QueryGraphEdges::GetConnections
                  ((vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> *)&local_b8,
                   this->query_graph,node,pJVar2);
        if (local_b8._M_impl.super__Vector_impl_data._M_start !=
            local_b8._M_impl.super__Vector_impl_data._M_finish) {
          bVar1 = TryEmitPair(this,node,pJVar2,
                              (vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> *)
                              &local_b8);
          if (bVar1) goto LAB_00a3b888;
LAB_00a3b8bd:
          ::std::
          _Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
          ::~_Vector_base(&local_b8);
          break;
        }
LAB_00a3b888:
        bVar1 = EnumerateCmpRecursive
                          (this,node,pJVar2,
                           (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)&local_a0);
        if (!bVar1) goto LAB_00a3b8bd;
        ::std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_erase(&local_a0,&local_c0);
        ::std::
        _Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
        ::~_Vector_base(&local_b8);
      }
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_a0);
    }
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d8);
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
  }
  return bVar6;
}

Assistant:

bool PlanEnumerator::EmitCSG(JoinRelationSet &node) {
	if (node.count == query_graph_manager.relation_manager.NumRelations()) {
		return true;
	}
	// create the exclusion set as everything inside the subgraph AND anything with members BELOW it
	unordered_set<idx_t> exclusion_set;
	for (idx_t i = 0; i < node.relations[0]; i++) {
		exclusion_set.insert(i);
	}
	UpdateExclusionSet(&node, exclusion_set);
	// find the neighbors given this exclusion set
	auto neighbors = query_graph.GetNeighbors(node, exclusion_set);
	if (neighbors.empty()) {
		return true;
	}

	//! Neighbors should be reversed when iterating over them.
	std::sort(neighbors.begin(), neighbors.end(), std::greater<idx_t>());
	for (idx_t i = 0; i < neighbors.size() - 1; i++) {
		D_ASSERT(neighbors[i] > neighbors[i + 1]);
	}

	// Dphyp paper missing this.
	// Because we are traversing in reverse order, we need to add neighbors whose number is smaller than the current
	// node to exclusion_set
	// This avoids duplicated enumeration
	unordered_set<idx_t> new_exclusion_set = exclusion_set;
	for (idx_t i = 0; i < neighbors.size(); ++i) {
		D_ASSERT(new_exclusion_set.find(neighbors[i]) == new_exclusion_set.end());
		new_exclusion_set.insert(neighbors[i]);
	}

	for (auto neighbor : neighbors) {
		// since the GetNeighbors only returns the smallest element in a list, the entry might not be connected to
		// (only!) this neighbor,  hence we have to do a connectedness check before we can emit it
		auto &neighbor_relation = query_graph_manager.set_manager.GetJoinRelation(neighbor);
		auto connections = query_graph.GetConnections(node, neighbor_relation);
		if (!connections.empty()) {
			if (!TryEmitPair(node, neighbor_relation, connections)) {
				return false;
			}
		}

		if (!EnumerateCmpRecursive(node, neighbor_relation, new_exclusion_set)) {
			return false;
		}

		new_exclusion_set.erase(neighbor);
	}
	return true;
}